

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O3

void Gia_ManPrintFanio(Gia_Man_t *pGia,int nNodes)

{
  int iVar1;
  Cof_Man_t *p;
  int *piVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  int level;
  timespec ts;
  timespec local_30;
  
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  p = Cof_ManCreateLogicSimple(pGia);
  iVar1 = Gia_ManLevelNum(pGia);
  p->nLevels = iVar1 + 1;
  piVar2 = (int *)calloc((long)(iVar1 + 1),4);
  p->pLevels = piVar2;
  Cof_ManPrintFanio(p);
  if (0 < nNodes) {
    iVar1 = p->nObjData;
    if ((0 < iVar1) && (piVar2 = p->pObjData, piVar2 != (int *)0x0)) {
      uVar3 = 0;
      do {
        piVar2[(ulong)uVar3 + 2] = 0;
        uVar3 = ((uint)piVar2[uVar3] >> 4 & 0xf) + ((uint)piVar2[uVar3] >> 8) + uVar3 + 6;
      } while ((int)uVar3 < iVar1);
    }
    p->nTravIds = 1;
    Gia_ManHashStart(pGia);
    Cof_ManPrintHighFanout(p,nNodes);
    Gia_ManHashStop(pGia);
    iVar1 = (int)pGia;
    Abc_Print(iVar1,"%s =","Memory for logic network");
    Abc_Print(iVar1,"%10.3f MB  ",(double)(p->nObjData << 2) * 9.5367431640625e-07);
    Abc_Print(iVar1,"%s =","Time");
    level = 3;
    iVar1 = clock_gettime(3,&local_30);
    if (iVar1 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    Abc_Print(level,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
  }
  Cof_ManStop(p);
  return;
}

Assistant:

void Gia_ManPrintFanio( Gia_Man_t * pGia, int nNodes )
{
    Cof_Man_t * p;
    abctime clk = Abc_Clock();
    p = Cof_ManCreateLogicSimple( pGia );
    p->nLevels = 1 + Gia_ManLevelNum( pGia );
    p->pLevels = ABC_CALLOC( int, p->nLevels );
    Cof_ManPrintFanio( p );

    if ( nNodes > 0 )
    {
    Cof_ManResetTravId( p );
    Gia_ManHashStart( pGia );
    Cof_ManPrintHighFanout( p, nNodes );
    Gia_ManHashStop( pGia );
ABC_PRMn( "Memory for logic network", 4*p->nObjData );
ABC_PRT( "Time", Abc_Clock() - clk );
    }

    Cof_ManStop( p );
}